

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert_to_sampled_image_pass.cpp
# Opt level: O3

unique_ptr<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>_>
 __thiscall
spvtools::opt::ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString
          (ConvertToSampledImagePass *this,char *str)

{
  char *pcVar1;
  char cVar2;
  int iVar3;
  vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
  *pvVar4;
  char *pcVar5;
  uint32_t binding;
  uint32_t descriptor_set;
  uint32_t local_48;
  uint32_t local_44;
  vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
  *local_40;
  DescriptorSetAndBinding local_38;
  
  if (str == (char *)0x0) {
    (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
  }
  else {
    pvVar4 = (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
              *)operator_new(0x18);
    (pvVar4->
    super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (pvVar4->
    super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (pvVar4->
    super__Vector_base<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pcVar5 = str + -1;
    local_40 = pvVar4;
    do {
      cVar2 = pcVar5[1];
      pcVar5 = pcVar5 + 1;
      iVar3 = isspace((int)cVar2);
    } while (iVar3 != 0);
    if (cVar2 != '\0') {
      do {
        local_44 = 0;
        pcVar5 = anon_unknown_18::ParseNumberUntilSeparator(pcVar5,&local_44);
        if ((pcVar5 == (char *)0x0) || (*pcVar5 != ':')) {
LAB_00582bb1:
          (this->super_Pass)._vptr_Pass = (_func_int **)0x0;
          if (local_40 ==
              (vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
               *)0x0) {
            return (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
                    )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
                      )this;
          }
          std::
          default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
          ::operator()((default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>
                        *)&local_40,local_40);
          return (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
                  )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
                    )this;
        }
        local_48 = 0;
        pcVar5 = anon_unknown_18::ParseNumberUntilSeparator(pcVar5 + 1,&local_48);
        pvVar4 = local_40;
        if (pcVar5 == (char *)0x0) goto LAB_00582bb1;
        local_38.descriptor_set = local_44;
        local_38.binding = local_48;
        std::
        vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>
        ::emplace_back<spvtools::opt::DescriptorSetAndBinding>(local_40,&local_38);
        pcVar5 = pcVar5 + -1;
        do {
          pcVar1 = pcVar5 + 1;
          pcVar5 = pcVar5 + 1;
          iVar3 = isspace((int)*pcVar1);
        } while (iVar3 != 0);
      } while (*pcVar5 != '\0');
    }
    (this->super_Pass)._vptr_Pass = (_func_int **)pvVar4;
  }
  return (__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
          )(__uniq_ptr_data<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>,_std::default_delete<std::vector<spvtools::opt::DescriptorSetAndBinding,_std::allocator<spvtools::opt::DescriptorSetAndBinding>_>_>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<VectorOfDescriptorSetAndBindingPairs>
ConvertToSampledImagePass::ParseDescriptorSetBindingPairsString(
    const char* str) {
  if (!str) return nullptr;

  auto descriptor_set_binding_pairs =
      MakeUnique<VectorOfDescriptorSetAndBindingPairs>();

  while (std::isspace(*str)) str++;  // skip leading spaces.

  // The parsing loop, break when points to the end.
  while (*str) {
    // Parse the descriptor set.
    uint32_t descriptor_set = 0;
    str = ParseNumberUntilSeparator(str, &descriptor_set);
    if (str == nullptr) return nullptr;

    // Find the ':', spaces between the descriptor set and the ':' are not
    // allowed.
    if (*str++ != ':') {
      // ':' not found
      return nullptr;
    }

    // Parse the binding.
    uint32_t binding = 0;
    str = ParseNumberUntilSeparator(str, &binding);
    if (str == nullptr) return nullptr;

    descriptor_set_binding_pairs->push_back({descriptor_set, binding});

    // Skip trailing spaces.
    while (std::isspace(*str)) str++;
  }

  return descriptor_set_binding_pairs;
}